

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O0

void __thiscall
QRhiTexture::QRhiTexture
          (QRhiTexture *this,QRhiImplementation *rhi,Format format_,QSize *pixelSize_,int depth_,
          int arraySize_,int sampleCount_,Flags flags_)

{
  long lVar1;
  undefined8 *in_RCX;
  undefined4 in_EDX;
  QRhiResource *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  undefined4 in_stack_00000008;
  QRhiImplementation *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QRhiResource::QRhiResource(in_RDI,in_stack_ffffffffffffffb8);
  in_RDI->_vptr_QRhiResource = (_func_int **)&PTR__QRhiTexture_00e1d590;
  *(undefined4 *)&in_RDI[1]._vptr_QRhiResource = in_EDX;
  *(undefined8 *)((long)&in_RDI[1]._vptr_QRhiResource + 4) = *in_RCX;
  *(undefined4 *)((long)&in_RDI[1].m_rhi + 4) = in_R8D;
  *(undefined4 *)&in_RDI[1].m_id = in_R9D;
  *(undefined4 *)((long)&in_RDI[1].m_id + 4) = in_stack_00000008;
  *(int *)&in_RDI[1].m_objectName.d.d = arraySize_;
  *(undefined4 *)((long)&in_RDI[1].m_objectName.d.d + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[1].m_objectName.d.ptr = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[1].m_objectName.d.ptr + 4) = 0;
  *(undefined1 *)&in_RDI[1].m_objectName.d.size = 0;
  *(undefined4 *)((long)&in_RDI[1].m_objectName.d.size + 4) = 0;
  *(undefined1 *)&in_RDI[2]._vptr_QRhiResource = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QRhiTexture::QRhiTexture(QRhiImplementation *rhi, Format format_, const QSize &pixelSize_, int depth_,
                         int arraySize_, int sampleCount_, Flags flags_)
    : QRhiResource(rhi),
      m_format(format_), m_pixelSize(pixelSize_), m_depth(depth_),
      m_arraySize(arraySize_), m_sampleCount(sampleCount_), m_flags(flags_)
{
}